

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

uint Extra_TruthCanonNN(uint uTruth,int nVars)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int Polarity;
  undefined4 local_34;
  
  iVar1 = 1 << ((byte)nVars & 0x1f);
  uVar4 = 0xffffffff;
  if (nVars != 0x1f) {
    local_34 = 1;
    if (1 < iVar1) {
      local_34 = iVar1;
    }
    uVar4 = 0xffffffff;
    Polarity = 0;
    do {
      uVar2 = Extra_TruthPolarize(uTruth,Polarity,nVars);
      if (uVar4 < uVar2) {
        uVar2 = uVar4;
      }
      uVar3 = Extra_TruthPolarize((~uTruth << (-(char)iVar1 & 0x1fU)) >> (-(char)iVar1 & 0x1fU),
                                  Polarity,nVars);
      uVar4 = uVar2;
      if (uVar3 <= uVar2) {
        uVar4 = uVar3;
      }
      Polarity = Polarity + 1;
    } while (local_34 != Polarity);
  }
  return uVar4;
}

Assistant:

unsigned Extra_TruthCanonNN( unsigned uTruth, int nVars )
{
    unsigned uTruthMin, uTruthC, uPhase;
    int nMints, i;
    nMints    = (1 << nVars);
    uTruthC   = (unsigned)( (~uTruth) & ((~((unsigned)0)) >> (32-nMints)) );
    uTruthMin = 0xFFFFFFFF;
    for ( i = 0; i < nMints; i++ )
    {
        uPhase = Extra_TruthPolarize( uTruth, i, nVars ); 
        if ( uTruthMin > uPhase )
            uTruthMin = uPhase;
        uPhase = Extra_TruthPolarize( uTruthC, i, nVars ); 
        if ( uTruthMin > uPhase )
            uTruthMin = uPhase;
    }
    return uTruthMin;
}